

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

char * BuildModuleFromSource
                 (Allocator *allocator,char *modulePath,char *moduleRoot,char *code,uint codeSize,
                 char **errorPos,char *errorBuf,uint errorBufSize,int optimizationLevel,
                 ArrayView<InplaceStr> activeImports,CompilerStatistics *statistics)

{
  Lexer *this;
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  Lexeme *pLVar6;
  Lexeme *pLVar7;
  size_t sVar8;
  ByteCode *bytecode;
  ArrayView<InplaceStr> activeImports_00;
  ByteCode *local_a898;
  TraceScope local_a890;
  CompilerContext local_a880;
  
  if (BuildModuleFromSource(Allocator*,char_const*,char_const*,char_const*,unsigned_int,char_const**,char*,unsigned_int,int,ArrayView<InplaceStr>,CompilerStatistics*)
      ::token == '\0') {
    iVar4 = __cxa_guard_acquire(&BuildModuleFromSource(Allocator*,char_const*,char_const*,char_const*,unsigned_int,char_const**,char*,unsigned_int,int,ArrayView<InplaceStr>,CompilerStatistics*)
                                 ::token);
    if (iVar4 != 0) {
      BuildModuleFromSource::token = NULLC::TraceGetToken("compiler","BuildModuleFromSource");
      __cxa_guard_release(&BuildModuleFromSource(Allocator*,char_const*,char_const*,char_const*,unsigned_int,char_const**,char*,unsigned_int,int,ArrayView<InplaceStr>,CompilerStatistics*)
                           ::token);
    }
  }
  NULLC::TraceScope::TraceScope(&local_a890,BuildModuleFromSource::token);
  NULLC::TraceLabel(modulePath);
  activeImports_00._12_4_ = 0;
  activeImports_00.data = activeImports.data;
  activeImports_00.count = activeImports.count;
  CompilerContext::CompilerContext(&local_a880,allocator,optimizationLevel,activeImports_00);
  local_a880.errorBuf = errorBuf;
  local_a880.errorBufSize = errorBufSize;
  local_a880.code = code;
  local_a880.moduleRoot = moduleRoot;
  bVar2 = CompileModuleFromSource(&local_a880);
  if (bVar2) {
    local_a880.statistics.startTime = NULLCTime::clockMicro();
    local_a880.statistics.finishTime = 0;
    local_a898 = (ByteCode *)0x0;
    GetBytecode(&local_a880,(char **)&local_a898);
    uVar3 = NULLCTime::clockMicro();
    CompilerStatistics::Finish(&local_a880.statistics,"Bytecode",uVar3);
    local_a880.statistics.startTime = NULLCTime::clockMicro();
    bytecode = local_a898;
    local_a880.statistics.finishTime = 0;
    pcVar5 = FindSource(local_a898);
    this = &local_a880.parseCtx.lexer;
    pLVar6 = Lexer::GetStreamStart(this);
    pLVar7 = Lexer::GetStreamStart(this);
    uVar3 = Lexer::GetStreamSize(this);
    for (; pLVar6 != pLVar7 + uVar3; pLVar6 = pLVar6 + 1) {
      pcVar1 = pLVar6->pos;
      if ((pcVar1 < code) || (code + codeSize < pcVar1)) break;
      pLVar6->pos = pcVar5 + ((long)pcVar1 - (long)code);
    }
    pLVar6 = Lexer::GetStreamStart(this);
    uVar3 = Lexer::GetStreamSize(this);
    BinaryCache::PutBytecode(modulePath,(char *)bytecode,pLVar6,uVar3);
    uVar3 = NULLCTime::clockMicro();
    CompilerStatistics::Finish(&local_a880.statistics,"BytecodeCache",uVar3);
    if (statistics != (CompilerStatistics *)0x0) {
      CompilerStatistics::Add(statistics,&local_a880.statistics);
    }
  }
  else {
    *errorPos = local_a880.errorPos;
    if (errorBufSize == 0 || errorBuf == (char *)0x0) {
      bytecode = (ByteCode *)0x0;
    }
    else {
      sVar8 = strlen(errorBuf);
      bytecode = (ByteCode *)0x0;
      NULLC::SafeSprintf(errorBuf + (sVar8 & 0xffffffff),(ulong)(errorBufSize - (int)sVar8),
                         " [in module \'%s\']",modulePath);
    }
  }
  CompilerContext::~CompilerContext(&local_a880);
  NULLC::TraceScope::~TraceScope(&local_a890);
  return (char *)bytecode;
}

Assistant:

char* BuildModuleFromSource(Allocator *allocator, const char *modulePath, const char *moduleRoot, const char *code, unsigned codeSize, const char **errorPos, char *errorBuf, unsigned errorBufSize, int optimizationLevel, ArrayView<InplaceStr> activeImports, CompilerStatistics *statistics)
{
	TRACE_SCOPE("compiler", "BuildModuleFromSource");
	TRACE_LABEL(modulePath);

	CompilerContext ctx(allocator, optimizationLevel, activeImports);

	ctx.errorBuf = errorBuf;
	ctx.errorBufSize = errorBufSize;

	ctx.code = code;
	ctx.moduleRoot = moduleRoot;

	if(!CompileModuleFromSource(ctx))
	{
		*errorPos = ctx.errorPos;

		if(errorBuf && errorBufSize)
		{
			unsigned currLen = (unsigned)strlen(errorBuf);
			NULLC::SafeSprintf(errorBuf + currLen, errorBufSize - currLen, " [in module '%s']", modulePath);
		}

		return NULL;
	}

	ctx.statistics.Start(NULLCTime::clockMicro());

	char *bytecode = NULL;
	GetBytecode(ctx, &bytecode);

	ctx.statistics.Finish("Bytecode", NULLCTime::clockMicro());

	ctx.statistics.Start(NULLCTime::clockMicro());

	Lexer &lexer = ctx.parseCtx.lexer;

	const char *newStart = FindSource((ByteCode*)bytecode);

	// We have to fix lexeme positions to the code that is saved in bytecode
	for(Lexeme *c = lexer.GetStreamStart(), *e = lexer.GetStreamStart() + lexer.GetStreamSize(); c != e; c++)
	{
		// Exit fix up if lexemes exited scope of the current file
		if(c->pos < code || c->pos > (code + codeSize))
			break;

		c->pos = newStart + (c->pos - code);
	}

	BinaryCache::PutBytecode(modulePath, bytecode, lexer.GetStreamStart(), lexer.GetStreamSize());

	ctx.statistics.Finish("BytecodeCache", NULLCTime::clockMicro());

	if(statistics)
		statistics->Add(ctx.statistics);

	return bytecode;
}